

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextbookBoyerMoore.cpp
# Opt level: O0

void __thiscall
UnifiedRegex::TextbookBoyerMoore<char16_t>::Setup
          (TextbookBoyerMoore<char16_t> *this,ArenaAllocator *allocator,Char *pat,CharCount patLen,
          int skip)

{
  int32 *ptr;
  int local_30;
  uint local_2c;
  int j;
  CharCount i;
  int skip_local;
  CharCount patLen_local;
  Char *pat_local;
  ArenaAllocator *allocator_local;
  TextbookBoyerMoore<char16_t> *this_local;
  
  for (local_2c = 0; local_2c < patLen; local_2c = local_2c + 1) {
    for (local_30 = 0; local_30 < skip; local_30 = local_30 + 1) {
      CharMap<char16_t,_int,_(UnifiedRegex::CharMapScheme)1>::Set
                (&this->lastOccurrence,allocator,pat[local_2c * skip + local_30],local_2c);
    }
  }
  ptr = TextbookBoyerMooreSetup<char16_t>::GetGoodSuffix(allocator,pat,patLen,skip);
  Memory::WriteBarrierPtr<int>::operator=(&this->goodSuffix,ptr);
  return;
}

Assistant:

void TextbookBoyerMoore<C>::Setup(ArenaAllocator * allocator, const Char * pat, CharCount patLen, int skip)
    {
        // character c |-> index of last occurrence of c in pat, otherwise -1
        for (CharCount i = 0; i < patLen; i++)
        {
            for (int j = 0; j < skip; j++)
                lastOccurrence.Set(allocator, pat[i * skip + j], i);
        }
        goodSuffix = TextbookBoyerMooreSetup<C>::GetGoodSuffix(allocator, pat, patLen, skip);
    }